

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O3

string * __thiscall
google::protobuf::text_format_unittest::CustomMessageFieldValuePrinter::PrintInt32_abi_cxx11_
          (string *__return_storage_ptr__,CustomMessageFieldValuePrinter *this,int32_t v)

{
  AlphaNum *in_R8;
  Hex hex;
  long *local_e8;
  size_t local_e0;
  long local_d8 [2];
  string local_c8;
  AlphaNum local_a8;
  size_type local_78;
  pointer local_70;
  AlphaNum local_48;
  
  TextFormat::FieldValuePrinter::PrintInt32_abi_cxx11_(&local_c8,&this->super_FieldValuePrinter,v);
  local_78 = local_c8._M_string_length;
  local_70 = local_c8._M_dataplus._M_p;
  local_a8.piece_._M_len = 5;
  local_a8.piece_._M_str = "  # x";
  local_d8[0] = 0;
  local_d8[1] = 0;
  local_e0 = 0;
  hex.width = (undefined1)local_c8._M_string_length;
  hex.fill = local_c8._M_string_length._1_1_;
  hex._10_6_ = local_c8._M_string_length._2_6_;
  hex.value = 0x3001;
  local_e8 = local_d8;
  absl::lts_20250127::AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
            ((lts_20250127 *)&local_e8,(StringifySink *)(ulong)(uint)v,hex);
  local_48.piece_._M_len = local_e0;
  local_48.piece_._M_str = (char *)local_e8;
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_78,&local_a8,&local_48,in_R8);
  if (local_e8 != local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PrintInt32(int32_t v) const override {
    return absl::StrCat(FieldValuePrinter::PrintInt32(v), "  # x",
                        absl::Hex(v));
  }